

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

iterator __thiscall
fmt::v7::
vformat_to<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>
          (v7 *this,iterator out,basic_string_view<char> format_str,
          basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          args,locale_ref loc)

{
  format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *last;
  buffer_appender<char> out_00;
  undefined1 value [16];
  undefined1 value_00 [16];
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  float value_01;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> this_00;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> end;
  custom_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *pcVar4
  ;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> end_00;
  undefined8 in_stack_ffffffffffffff68;
  undefined2 in_stack_ffffffffffffff70;
  undefined6 in_stack_ffffffffffffff72;
  writer local_88;
  writer write;
  format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  h;
  format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_38;
  
  pcVar4 = (custom_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            *)args.desc_;
  pcVar3 = format_str.data_;
  this_00.container = (buffer<char> *)this;
  if ((pcVar3 == (char *)0x2) &&
     (this_00 = out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
     bVar1 = detail::equal2((char *)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                    container,"{}"), bVar1)) {
    if ((long)format_str.size_ < 0) {
      if (((int)(uint)format_str.size_ < 1) || (uVar2 = *(uint *)&pcVar4[1].value, uVar2 == 0))
      goto LAB_00210503;
    }
    else {
      uVar2 = (uint)format_str.size_ & 0xf;
      if (((undefined1  [16])format_str & (undefined1  [16])0xf) == (undefined1  [16])0x0) {
LAB_00210503:
        detail::error_handler::on_error((error_handler *)this_00.container,"argument not found");
      }
    }
    out_00.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
         (back_insert_iterator<fmt::v7::detail::buffer<char>_>)pcVar4->value;
    value_01 = out_00.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._0_4_;
    write.handler_ =
         (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          *)this;
    switch(uVar2) {
    case 1:
      this = (v7 *)detail::write<char,_fmt::v7::detail::buffer_appender<char>,_int,_0>
                             ((buffer_appender<char>)this,(int)value_01);
      break;
    case 2:
      this = (v7 *)detail::write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_int,_0>
                             ((buffer_appender<char>)this,(uint)value_01);
      break;
    case 3:
      this = (v7 *)detail::write<char,_fmt::v7::detail::buffer_appender<char>,_long_long,_0>
                             ((buffer_appender<char>)this,
                              (longlong)
                              out_00.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container);
      break;
    case 4:
      this = (v7 *)detail::
                   write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_long_long,_0>
                             ((buffer_appender<char>)this,
                              (unsigned_long_long)
                              out_00.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container);
      break;
    case 5:
      value._8_2_ = in_stack_ffffffffffffff70;
      value._0_8_ = in_stack_ffffffffffffff68;
      value._10_6_ = in_stack_ffffffffffffff72;
      this = (v7 *)detail::write<char,_fmt::v7::detail::buffer_appender<char>,___int128,_0>
                             ((detail *)this,out_00,(__int128)value);
      break;
    case 6:
      value_00._8_2_ = in_stack_ffffffffffffff70;
      value_00._0_8_ = in_stack_ffffffffffffff68;
      value_00._10_6_ = in_stack_ffffffffffffff72;
      this = (v7 *)detail::write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned___int128,_0>
                             ((detail *)this,out_00,(unsigned___int128)value_00);
      break;
    case 7:
      this = (v7 *)detail::write<char,fmt::v7::detail::buffer_appender<char>>
                             ((buffer_appender<char>)this,
                              (bool)((byte)out_00.
                                           super_back_insert_iterator<fmt::v7::detail::buffer<char>_>
                                           .container & 1));
      break;
    case 8:
      this = (v7 *)detail::write<char,fmt::v7::detail::buffer_appender<char>>
                             ((buffer_appender<char>)this,
                              (byte)out_00.
                                    super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                    container);
      break;
    case 9:
      this = (v7 *)detail::write<char,_fmt::v7::detail::buffer_appender<char>,_float,_0>
                             ((buffer_appender<char>)this,value_01);
      break;
    case 10:
      this = (v7 *)detail::write<char,_fmt::v7::detail::buffer_appender<char>,_double,_0>
                             ((buffer_appender<char>)this,
                              (double)out_00.
                                      super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                      container);
      break;
    case 0xb:
      this = (v7 *)detail::write<char,_fmt::v7::detail::buffer_appender<char>,_long_double,_0>
                             ((buffer_appender<char>)this,*(longdouble *)pcVar4);
      break;
    case 0xc:
      this = (v7 *)detail::write<char,fmt::v7::detail::buffer_appender<char>>
                             ((buffer_appender<char>)this,
                              (char *)out_00.
                                      super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                      container);
      break;
    case 0xd:
      detail::buffer<char>::append<char>
                ((buffer<char> *)this,
                 (char *)out_00.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                 ,(char *)(pcVar4->format +
                          (long)out_00.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container));
      break;
    case 0xe:
      this = (v7 *)detail::write<char,fmt::v7::detail::buffer_appender<char>>
                             ((buffer_appender<char>)this,
                              (void *)out_00.
                                      super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                      container);
      break;
    case 0xf:
      this = (v7 *)detail::default_arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>::
                   operator()((default_arg_formatter<fmt::v7::detail::buffer_appender<char>,_char> *
                              )&write,(handle)*pcVar4);
      break;
    default:
      this = (v7 *)detail::write<char,fmt::v7::detail::buffer_appender<char>>(this);
    }
  }
  else {
    last = (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            *)(pcVar3 + (long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container);
    if ((long)pcVar3 < 0x20) {
      end_00 = out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      while (end.container = end_00.container,
            (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
             *)end.container != last) {
        end_00.container = (buffer<char> *)((long)&(end.container)->_vptr_buffer + 1);
        if (*(char *)&(end.container)->_vptr_buffer == '}') {
          if (((format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)end_00.container == last) || (*(char *)end_00.container != '}')) {
            detail::error_handler::on_error
                      ((error_handler *)this_00.container,"unmatched \'}\' in format string");
          }
          this_00.container = (buffer<char> *)&write;
          detail::
          format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::on_text((format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)&write,
                    (char *)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                    ,(char *)end_00.container);
          out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
               (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
               ((long)&(end.container)->_vptr_buffer + 2);
          end_00.container =
               (buffer<char> *)
               out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
        }
        else if (*(char *)&(end.container)->_vptr_buffer == '{') {
          detail::
          format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::on_text((format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)&write,
                    (char *)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                    ,(char *)end.container);
          out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
               (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
               detail::
               parse_replacement_field<char,fmt::v7::detail::format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&>
                         ((char *)end.container,(char *)last,
                          (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)&write);
          end_00.container =
               (buffer<char> *)
               out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
          this_00.container = end.container;
        }
      }
      detail::
      format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::on_text((format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                 *)&write,
                (char *)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                (char *)last);
    }
    else {
      local_88.handler_ =
           (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            *)&write;
      while (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container !=
             (back_insert_iterator<fmt::v7::detail::buffer<char>_>)last) {
        local_38 = (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    *)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
        if ((*(char *)&((buffer<char> *)
                       out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)->
                       _vptr_buffer != '{') &&
           (bVar1 = detail::find<false,char,char_const*>
                              ((char *)((long)&((buffer<char> *)
                                               out.
                                               super_back_insert_iterator<fmt::v7::detail::buffer<char>_>
                                               .container)->_vptr_buffer + 1),(char *)last,'{',
                               (char **)&local_38), !bVar1)) {
          detail::
          parse_format_string<false,_char,_fmt::v7::detail::format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&>
          ::writer::operator()
                    (&local_88,
                     (char *)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                             container,(char *)last);
          return (iterator)(back_insert_iterator<fmt::v7::detail::buffer<char>_>)this;
        }
        detail::
        parse_format_string<false,_char,_fmt::v7::detail::format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&>
        ::writer::operator()
                  (&local_88,
                   (char *)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                   (char *)local_38);
        out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
             (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
             detail::
             parse_replacement_field<char,fmt::v7::detail::format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&>
                       ((char *)local_38,(char *)last,
                        (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)&write);
      }
    }
  }
  return (iterator)(back_insert_iterator<fmt::v7::detail::buffer<char>_>)this;
}

Assistant:

typename Context::iterator vformat_to(
    typename ArgFormatter::iterator out, basic_string_view<Char> format_str,
    basic_format_args<Context> args,
    detail::locale_ref loc = detail::locale_ref()) {
  if (format_str.size() == 2 && detail::equal2(format_str.data(), "{}")) {
    auto arg = args.get(0);
    if (!arg) detail::error_handler().on_error("argument not found");
    using iterator = typename ArgFormatter::iterator;
    return visit_format_arg(
        detail::default_arg_formatter<iterator, Char>{out, args, loc}, arg);
  }
  detail::format_handler<ArgFormatter, Char, Context> h(out, format_str, args,
                                                        loc);
  detail::parse_format_string<false>(format_str, h);
  return h.context.out();
}